

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O1

BitMap * re2c::BitMap::find(Go *g,State *x)

{
  uint32_t n2;
  Span *b2;
  bool bVar1;
  BitMap *pBVar2;
  bool bVar3;
  
  bVar3 = first == (BitMap *)0x0;
  if (!bVar3) {
    b2 = g->span;
    n2 = g->nSpans;
    pBVar2 = first;
    do {
      bVar1 = matches(pBVar2->go->span,pBVar2->go->nSpans,pBVar2->on,b2,n2,x);
      if (bVar1) {
        if (!bVar3) {
          return pBVar2;
        }
        break;
      }
      pBVar2 = pBVar2->next;
      bVar3 = pBVar2 == (BitMap *)0x0;
    } while (!bVar3);
  }
  pBVar2 = (BitMap *)operator_new(0x20);
  pBVar2->go = g;
  pBVar2->on = x;
  pBVar2->next = first;
  pBVar2->i = 0;
  pBVar2->m = 0;
  first = pBVar2;
  return pBVar2;
}

Assistant:

const BitMap *BitMap::find(const Go *g, const State *x)
{
	for (const BitMap *b = first; b; b = b->next)
	{
		if (matches(b->go->span, b->go->nSpans, b->on, g->span, g->nSpans, x))
		{
			return b;
		}
	}

	return new BitMap(g, x);
}